

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O1

DFsVariable * __thiscall DFsScript::VariableForName(DFsScript *this,char *name)

{
  anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1 aVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1 aVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  
  lVar5 = 0;
  iVar3 = 0;
  if (*name != '\0') {
    iVar6 = (int)*name + (int)name[1];
    if (name[1] != '\0') {
      if (name[2] == '\0') {
        iVar3 = 0;
      }
      else {
        iVar3 = (int)name[3];
      }
      iVar3 = iVar3 + name[2];
    }
    uVar7 = iVar6 + iVar3;
    uVar4 = iVar6 + 0xf + iVar3;
    if (-1 < (int)uVar7) {
      uVar4 = uVar7;
    }
    lVar5 = (long)(int)(uVar7 - (uVar4 & 0xfffffff0));
  }
  aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)this->variables[lVar5].field_0.p;
  if ((aVar1.p != (DFsVariable *)0x0) && ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) != 0)) {
    this->variables[lVar5].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
    aVar1.p = (DFsVariable *)0x0;
  }
  while( true ) {
    aVar2 = aVar1;
    if (aVar2.p == (DFsVariable *)0x0) {
      return (DFsVariable *)0x0;
    }
    iVar3 = strcmp(name,((aVar2.p)->Name).Chars);
    if (iVar3 == 0) break;
    aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)((aVar2.p)->next).field_0.p;
    if ((aVar1.p != (DFsVariable *)0x0) && ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) != 0)) {
      ((aVar2.p)->next).field_0.p = (DFsVariable *)0x0;
      aVar1.p = (DFsVariable *)0x0;
    }
  }
  return aVar2.p;
}

Assistant:

DFsVariable *DFsScript::VariableForName(const char *name)
{
	int n = variable_hash(name);
	DFsVariable *current = variables[n];
	
	while(current)
    {
		if(!strcmp(name, current->Name))        // found it?
			return current;         
		current = current->next;        // check next in chain
    }
	
	return NULL;
}